

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

FilePath * __thiscall testing::internal::FilePath::RemoveDirectoryName(FilePath *this)

{
  char *pcVar1;
  string *in_RDI;
  char *last_sep;
  FilePath *in_stack_ffffffffffffff88;
  FilePath *in_stack_ffffffffffffff90;
  string *this_00;
  undefined6 in_stack_ffffffffffffffc0;
  byte bVar2;
  allocator<char> in_stack_ffffffffffffffc7;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  pcVar1 = FindLastPathSeparator(in_stack_ffffffffffffff90);
  bVar2 = 0;
  if (pcVar1 == (char *)0x0) {
    FilePath(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffffc7,CONCAT16(1,in_stack_ffffffffffffffc0)));
    FilePath((FilePath *)this_00,in_RDI);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  }
  return (FilePath *)this_00;
}

Assistant:

FilePath FilePath::RemoveDirectoryName() const {
  const char* const last_sep = FindLastPathSeparator();
  return last_sep ? FilePath(last_sep + 1) : *this;
}